

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O2

conspage * next_conspage(void)

{
  conspage *base;
  LispPTR LVar1;
  conspage *base_00;
  LispPTR *pLVar2;
  ulong uVar3;
  bool bVar4;
  conspage *pcVar5;
  
  base_00 = (conspage *)alloc_mdspage(5);
  base = base_00 + 0x20;
  pcVar5 = (conspage *)0x0;
  init_conspage(base,0);
  LVar1 = LPageFromNative(base);
  init_conspage(base_00,LVar1);
  bVar4 = true;
  pLVar2 = &ListpDTD->dtd_nextpage;
  while (*pLVar2 - 1 < 0xfffffffe) {
    uVar3 = (ulong)(*pLVar2 << 8);
    pcVar5 = (conspage *)(Lisp_world + uVar3);
    bVar4 = false;
    pLVar2 = (LispPTR *)(Lisp_world + uVar3 + 6);
  }
  LVar1 = LPageFromNative(base_00);
  pLVar2 = &pcVar5->next_page;
  if (bVar4) {
    pLVar2 = &ListpDTD->dtd_nextpage;
  }
  *pLVar2 = LVar1;
  if (base_00[0x20].next_page != 0) {
    error("page2 has a next page??");
  }
  if (base == pcVar5) {
    error("loop in conspage next_pages");
  }
  return base_00;
}

Assistant:

struct conspage *next_conspage(void) {
  struct conspage *page1; /* Allocated 1st MDS page */
  struct conspage *page2; /* Allocated 2nd MDS page */
  struct conspage *pg, *priorpg;
  LispPTR next, prior;

#ifdef NEWCDRCODING
  /* Allocate 2 conspages and get 1st page base */
  page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);
  /* Calculate next conspage's base address */
  page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

  init_conspage(page2, 0); /* No next page */
  init_conspage(page1, LPageFromNative(page2));

  priorpg = NULL;
  prior = 0;
  for (pg = (struct conspage *)NativeAligned4FromLPage(next = ListpDTD->dtd_nextpage);
       next && (next != CONSPAGE_LAST);
       pg = (struct conspage *)NativeAligned4FromLPage(next = pg->next_page)) {
    priorpg = pg;
    prior = next;
  }

  if (prior)
    priorpg->next_page = LPageFromNative(page1);
  else
    ListpDTD->dtd_nextpage = LPageFromNative(page1);

  if (page2->next_page) error("page2 has a next page??");
  if (page2 == priorpg) error("loop in conspage next_pages");
#else
  for (next = (int)ListpDTD->dtd_nextpage; /* /!\ Note no exit condition /!\ */ /* get next free conspage */
       ; ListpDTD->dtd_nextpage = next = page1->next_page, page1->next_page = 0xffff) {
    if (next == 0) {
      /* Allocate 2 conspages and get 1st page base */
      page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);

      /* Calculate next conspage's base address */
      page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

      /* XXX: why is the link for page2's next here?
       * when it was previously commented as "Doesn't exist next page"
       */
      init_conspage(page2, ListpDTD->dtd_nextpage);
      init_conspage(page1, LPageFromNative(page2));

      ListpDTD->dtd_nextpage = LPageFromNative(page1);
      goto ex; /* replaced break */
    } else {
      page1 = (struct conspage *)NativeAligned4FromLPage(next); /*Jan-21*/
    }

    if (page1->count > 1) break;

  } /* for loop end */
#endif /* NEWCDRCODING */
ex:
  return (page1);
}